

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.h
# Opt level: O1

vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
* FixedDegreeNetwork::generate_block_links
            (vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             *__return_storage_ptr__,uint degree,uint blocks)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  undefined4 in_register_00000034;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  allocator_type local_6d;
  uint local_6c;
  uint local_68;
  int local_64;
  ulong local_60;
  uint local_58;
  int local_54;
  uint local_50;
  uint local_4c;
  undefined8 local_48;
  ulong local_40;
  ulong local_38;
  
  local_48 = CONCAT44(in_register_00000034,degree);
  uVar5 = degree + 1;
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::vector(__return_storage_ptr__,(ulong)(uVar5 * blocks),&local_6d);
  if (blocks != 0) {
    uVar2 = (ulong)uVar5;
    local_60 = 0;
    local_6c = 1;
    local_68 = uVar5;
    local_58 = blocks;
    local_40 = uVar2;
    do {
      if (local_68 != 0) {
        local_54 = (int)local_60 * local_68;
        local_64 = (int)local_48;
        local_38 = 0;
        uVar5 = local_6c;
        do {
          uVar1 = local_38 + 1;
          if (uVar1 < uVar2) {
            uVar6 = (int)local_38 + local_54;
            iVar3 = local_64;
            uVar4 = uVar5;
            local_38 = uVar1;
            do {
              local_4c = uVar4;
              std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::_M_insert_unique<unsigned_int>
                        (&(__return_storage_ptr__->
                          super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar6]._M_t,&local_4c);
              local_50 = uVar6;
              std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::_M_insert_unique<unsigned_int>
                        (&(__return_storage_ptr__->
                          super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar4]._M_t,&local_50);
              uVar4 = uVar4 + 1;
              iVar3 = iVar3 + -1;
              uVar1 = local_38;
            } while (iVar3 != 0);
          }
          local_38 = uVar1;
          uVar5 = uVar5 + 1;
          local_64 = local_64 + -1;
          uVar2 = local_40;
        } while (local_38 != local_40);
      }
      uVar5 = (int)local_60 + 1;
      local_60 = (ulong)uVar5;
      local_6c = local_6c + local_68;
    } while (uVar5 != local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<std::set<unsigned int> > generate_block_links(unsigned int degree,
                                                                     unsigned int blocks) {
        unsigned int nodes_per_block = degree + 1;
        std::vector<std::set<unsigned int> > links(nodes_per_block*blocks);

        for (unsigned int block_i = 0; block_i < blocks; block_i++)
            for (unsigned int node_i = 0; node_i < nodes_per_block; node_i++)
                for (unsigned int node_j = node_i + 1; node_j < nodes_per_block; node_j++) {
                    links[node_i + nodes_per_block*block_i].insert(node_j + nodes_per_block*block_i);
                    links[node_j + nodes_per_block*block_i].insert(node_i + nodes_per_block*block_i);
                }
        return links;
    }